

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

uint __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetMarkCountForSweep
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  SmallHeapBlockBitVector *pSVar5;
  undefined1 local_110 [8];
  SmallHeapBlockBitVector temp;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  temp.data[0x1f].word = (Type)this;
  bVar2 = IsFreeBitsValid(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4c5,"(IsFreeBitsValid())","IsFreeBitsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVStatic<2048UL>::BVStatic((BVStatic<2048UL> *)local_110);
  pSVar5 = GetMarkedBitVector(this);
  BVStatic<2048UL>::Copy((BVStatic<2048UL> *)local_110,pSVar5);
  pSVar5 = GetInvalidBitVector(this);
  BVStatic<2048UL>::Minus((BVStatic<2048UL> *)local_110,pSVar5);
  if (this->freeCount != 0) {
    pSVar5 = GetFreeBitVector(this);
    BVStatic<2048UL>::Minus((BVStatic<2048UL> *)local_110,pSVar5);
  }
  BVar3 = BVStatic<2048UL>::Count((BVStatic<2048UL> *)local_110);
  return BVar3;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountForSweep()
{
    Assert(IsFreeBitsValid());

    // Make a local copy of mark bits, so we don't modify the actual mark bits.
    SmallHeapBlockBitVector temp;
    temp.Copy(this->GetMarkedBitVector());

    // Remove any invalid bits that may have been set
    temp.Minus(this->GetInvalidBitVector());

    // Remove the mark bit for things that are still free
    if (this->freeCount != 0)
    {
        temp.Minus(this->GetFreeBitVector());
    }

    return temp.Count();
}